

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

void end_pass(ftrl *g)

{
  vw *all;
  bool bVar1;
  string sStack_38;
  
  all = g->all;
  if (all->holdout_set_off == false) {
    bVar1 = summarize_holdout_set(all,&g->no_win_counter);
    if (bVar1) {
      std::__cxx11::string::string((string *)&sStack_38,(string *)&all->final_regressor_name);
      finalize_regressor(all,&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
    if ((g->early_stop_thres == g->no_win_counter) &&
       ((all->check_holdout_every_n_passes < 2 ||
        (all->current_pass % all->check_holdout_every_n_passes == 0)))) {
      set_done(all);
    }
  }
  return;
}

Assistant:

void end_pass(ftrl& g)
{
  vw& all = *g.all;

  if (!all.holdout_set_off)
  {
    if (summarize_holdout_set(all, g.no_win_counter))
      finalize_regressor(all, all.final_regressor_name);
    if ((g.early_stop_thres == g.no_win_counter) &&
        ((all.check_holdout_every_n_passes <= 1) || ((all.current_pass % all.check_holdout_every_n_passes) == 0)))
      set_done(all);
  }
}